

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spaceusage.c
# Opt level: O2

sizes fuse8(size_t n)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  uint32_t uVar11;
  uint uVar12;
  size_t i;
  void *pvVar13;
  size_t sVar14;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  uint64_t uVar15;
  ulong uVar16;
  uint32_t i_3;
  int iVar17;
  uint32_t i_1;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  size_t sVar21;
  uint32_t arity;
  uint32_t in_ESI;
  int iVar22;
  uint uVar24;
  ulong uVar25;
  ulong __nmemb;
  ulong uVar26;
  uint32_t i_2;
  byte bVar27;
  int iVar28;
  byte bVar29;
  byte bVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  void *__ptr_04;
  double dVar36;
  undefined1 auVar37 [16];
  sizes sVar38;
  uint64_t local_c8;
  uint local_c0;
  uint local_b8 [4];
  uint local_a8;
  ulong local_a0;
  uint64_t *local_98;
  void *local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  uint local_5c;
  size_t local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  uint64_t rng_counter;
  int iVar23;
  
  iVar17 = 0;
  arity = (uint32_t)n;
  if (arity == 0) {
    iVar34 = 3;
    uVar12 = 4;
  }
  else {
    uVar11 = binary_fuse_calculate_segment_length(arity,in_ESI);
    uVar12 = 0x40000;
    if (uVar11 < 0x40000) {
      uVar12 = uVar11;
    }
    iVar34 = uVar12 - 1;
    if (arity != 1) {
      dVar36 = binary_fuse_calculate_size_factor(arity,in_ESI);
      dVar36 = round(dVar36 * (double)(n & 0xffffffff));
      iVar17 = (int)(long)dVar36;
    }
  }
  uVar35 = (((iVar34 - ((uVar12 + iVar17) - 1) % uVar12) + uVar12 + iVar17) - 1) / uVar12;
  uVar33 = uVar35 - 2;
  if (uVar35 < 3) {
    uVar33 = 1;
  }
  __nmemb = (ulong)((uVar33 + 2) * uVar12);
  pvVar13 = calloc(__nmemb,1);
  if (pvVar13 == (void *)0x0) {
    puts("allocation failed");
    sVar14 = 0;
    sVar21 = 0;
    goto LAB_001020da;
  }
  local_5c = uVar33 * uVar12;
  local_98 = (uint64_t *)malloc(n * 8);
  for (sVar14 = 0; n != sVar14; sVar14 = sVar14 + 1) {
    local_98[sVar14] = sVar14;
  }
  local_a0 = CONCAT44(local_a0._4_4_,iVar34);
  rng_counter = 0x726b2b9d438b9d4d;
  local_90 = pvVar13;
  local_c8 = binary_fuse_rng_splitmix64(&rng_counter);
  pvVar13 = calloc((ulong)(arity + 1),8);
  __ptr = malloc(__nmemb * 4);
  __ptr_00 = calloc(__nmemb,1);
  __ptr_01 = malloc(n & 0xffffffff);
  __ptr_02 = calloc(__nmemb,8);
  iVar17 = 0;
  do {
    iVar17 = iVar17 + 1;
    uVar35 = 1 << ((byte)iVar17 & 0x1f);
  } while (uVar35 < uVar33);
  local_50 = (ulong)uVar35;
  __ptr_03 = malloc(local_50 * 4);
  auVar37._0_4_ = -(uint)((int)((ulong)__ptr >> 0x20) == 0 && (int)__ptr == 0);
  auVar37._4_4_ = -(uint)((int)__ptr_00 == 0 && (int)((ulong)__ptr_00 >> 0x20) == 0);
  auVar37._8_4_ = -(uint)((int)((ulong)__ptr_01 >> 0x20) == 0 && (int)__ptr_01 == 0);
  auVar37._12_4_ = -(uint)((int)__ptr_02 == 0 && (int)((ulong)__ptr_02 >> 0x20) == 0);
  iVar34 = movmskps((int)__ptr_03,auVar37);
  if (((iVar34 == 0) && (pvVar13 != (void *)0x0)) && (__ptr_03 != (void *)0x0)) {
    *(undefined8 *)((long)pvVar13 + (n & 0xffffffff) * 8) = 1;
    local_40 = (ulong)(0x40 - iVar17);
    local_58 = __nmemb * 8;
    uVar33 = (uint)local_a0;
    local_70 = (ulong)((uint)local_a0 & 0x3ffff);
    local_68 = (ulong)uVar12;
    local_78 = (ulong)uVar12 * 2;
    uVar18 = 0;
    while ((int)uVar18 != 100) {
      local_48 = (ulong)((int)uVar18 + 1);
      uVar12 = 0;
      for (uVar18 = 0; local_50 != uVar18; uVar18 = uVar18 + 1) {
        *(uint *)((long)__ptr_03 + uVar18 * 4) = uVar12 >> ((byte)iVar17 & 0x1f);
        uVar12 = uVar12 + (int)n;
      }
      uVar18 = n & 0xffffffff;
      for (uVar32 = 0; __ptr_04 = local_90, uVar32 != uVar18; uVar32 = uVar32 + 1) {
        uVar15 = binary_fuse_murmur64(local_98[uVar32] + local_c8);
        uVar19 = uVar15 >> ((byte)local_40 & 0x3f);
        while( true ) {
          uVar12 = *(uint *)((long)__ptr_03 + uVar19 * 4);
          if (*(long *)((long)pvVar13 + (ulong)uVar12 * 8) == 0) break;
          uVar19 = (ulong)((int)uVar19 + 1U & uVar35 - 1);
        }
        *(uint64_t *)((long)pvVar13 + (ulong)uVar12 * 8) = uVar15;
        *(uint *)((long)__ptr_03 + uVar19 * 4) = uVar12 + 1;
      }
      uVar32 = 0;
      local_80 = 0;
      bVar10 = false;
      local_a0 = uVar18;
      while( true ) {
        uVar19 = CONCAT44(0,local_5c);
        iVar34 = (int)local_68;
        iVar22 = (int)local_78;
        iVar23 = (int)local_80;
        if (uVar18 == uVar32) break;
        uVar18 = *(ulong *)((long)pvVar13 + uVar32 * 8);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar18;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar19;
        lVar20 = SUB168(auVar4 * auVar7,8);
        *(char *)((long)__ptr_00 + lVar20) = *(char *)((long)__ptr_00 + lVar20) + '\x04';
        puVar1 = (ulong *)((long)__ptr_02 + lVar20 * 8);
        *puVar1 = *puVar1 ^ uVar18;
        iVar28 = SUB164(auVar4 * auVar7,8);
        uVar16 = (ulong)((uint)(uVar18 >> 0x12) & (uint)local_70 ^ iVar28 + iVar34);
        *(byte *)((long)__ptr_00 + uVar16) = (*(byte *)((long)__ptr_00 + uVar16) ^ 1) + 4;
        puVar1 = (ulong *)((long)__ptr_02 + uVar16 * 8);
        *puVar1 = *puVar1 ^ uVar18;
        uVar26 = (ulong)(uVar33 & (uint)uVar18 ^ iVar22 + iVar28);
        bVar29 = *(char *)((long)__ptr_00 + uVar26) + 4;
        uVar19 = *(ulong *)((long)__ptr_02 + uVar26 * 8);
        uVar25 = uVar19 ^ uVar18;
        *(ulong *)((long)__ptr_02 + uVar26 * 8) = uVar25;
        bVar27 = bVar29 ^ 2;
        *(byte *)((long)__ptr_00 + uVar26) = bVar27;
        uVar2 = *(ulong *)((long)__ptr_02 + lVar20 * 8);
        uVar3 = *(ulong *)((long)__ptr_02 + uVar16 * 8);
        if (((uVar25 & uVar2 & uVar3) == 0) &&
           ((((uVar2 == 0 && (*(char *)((long)__ptr_00 + lVar20) == '\b')) ||
             ((uVar3 == 0 && (*(char *)((long)__ptr_00 + uVar16) == '\b')))) ||
            ((uVar19 == uVar18 && (bVar29 == 10)))))) {
          local_80 = (ulong)(iVar23 + 1);
          *(char *)((long)__ptr_00 + lVar20) = *(char *)((long)__ptr_00 + lVar20) + -4;
          *(ulong *)((long)__ptr_02 + lVar20 * 8) = uVar2 ^ uVar18;
          bVar27 = *(byte *)((long)__ptr_00 + uVar16);
          puVar1 = (ulong *)((long)__ptr_02 + uVar16 * 8);
          *puVar1 = *puVar1 ^ uVar18;
          *(byte *)((long)__ptr_00 + uVar16) = (bVar27 ^ 1) - 4;
          bVar27 = (*(byte *)((long)__ptr_00 + uVar26) ^ 2) - 4;
          *(byte *)((long)__ptr_00 + uVar26) = bVar27;
          puVar1 = (ulong *)((long)__ptr_02 + uVar26 * 8);
          *puVar1 = *puVar1 ^ uVar18;
        }
        if (*(byte *)((long)__ptr_00 + lVar20) < 4) {
          bVar10 = true;
        }
        if (*(byte *)((long)__ptr_00 + uVar16) < 4) {
          bVar10 = true;
        }
        if (bVar27 < 4) {
          bVar10 = true;
        }
        uVar32 = uVar32 + 1;
        uVar18 = local_a0;
      }
      if (!bVar10) {
        uVar12 = 0;
        for (uVar32 = 0; __nmemb != uVar32; uVar32 = uVar32 + 1) {
          *(int *)((long)__ptr + (ulong)uVar12 * 4) = (int)uVar32;
          uVar12 = uVar12 + ((*(byte *)((long)__ptr_00 + uVar32) & 0xfc) == 4);
        }
        local_88 = 0;
        local_c0 = 0xffffffff;
        do {
          iVar28 = -uVar12;
          do {
            uVar12 = uVar12 - 1;
            uVar24 = (uint)local_88;
            if (iVar28 == 0) {
              if (uVar24 + iVar23 == (int)n) goto LAB_001020fd;
              if (iVar23 != 0) {
                n = binary_fuse_sort_and_remove_dup(local_98,uVar18);
                uVar18 = n & 0xffffffff;
              }
              goto LAB_00101fd4;
            }
            uVar32 = (ulong)*(uint *)((long)__ptr + (ulong)uVar12 * 4);
            bVar27 = *(byte *)((long)__ptr_00 + uVar32);
            iVar28 = iVar28 + 1;
          } while ((bVar27 & 0xfc) != 4);
          uVar18 = *(ulong *)((long)__ptr_02 + uVar32 * 8);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = uVar18;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar19;
          local_b8[3] = SUB164(auVar5 * auVar8,8);
          local_b8[1] = (uint)(uVar18 >> 0x12) & (uint)local_70 ^ iVar34 + local_b8[3];
          local_b8[2] = uVar33 & (uint)uVar18 ^ iVar22 + local_b8[3];
          local_a8 = local_b8[1];
          uVar31 = bVar27 & 3;
          bVar30 = (byte)uVar31;
          *(byte *)((long)__ptr_01 + local_88) = bVar30;
          *(ulong *)((long)pvVar13 + local_88 * 8) = uVar18;
          local_88 = (ulong)(uVar24 + 1);
          uVar32 = (ulong)local_b8[(ulong)uVar31 + 1];
          *(uint *)((long)__ptr + (ulong)uVar12 * 4) = local_b8[(ulong)uVar31 + 1];
          bVar27 = *(byte *)((long)__ptr_00 + uVar32);
          uVar12 = (uint)((bVar27 & 0xfc) == 8);
          bVar29 = bVar30 - 2;
          if (bVar30 < 2) {
            bVar29 = bVar30 + 1;
          }
          puVar1 = (ulong *)((long)__ptr_02 + uVar32 * 8);
          *puVar1 = *puVar1 ^ uVar18;
          *(byte *)((long)__ptr_00 + uVar32) = bVar29 ^ bVar27 - 4;
          uVar32 = (ulong)local_b8[uVar31 + 2];
          *(uint *)((long)__ptr + (ulong)(uVar12 - iVar28) * 4) = local_b8[uVar31 + 2];
          uVar12 = (((*(byte *)((long)__ptr_00 + uVar32) & 0xfc) == 8) + uVar12) - iVar28;
          bVar27 = (char)(uVar31 + 2) - 3;
          if ((ulong)uVar31 == 0) {
            bVar27 = 2;
          }
          *(byte *)((long)__ptr_00 + uVar32) = bVar27 ^ *(byte *)((long)__ptr_00 + uVar32) - 4;
          puVar1 = (ulong *)((long)__ptr_02 + uVar32 * 8);
          *puVar1 = *puVar1 ^ uVar18;
          local_c0 = local_c0 + 1;
          uVar18 = local_a0;
        } while( true );
      }
LAB_00101fd4:
      memset(pvVar13,0,uVar18 << 3);
      memset(__ptr_00,0,__nmemb);
      memset(__ptr_02,0,local_58);
      local_c8 = binary_fuse_rng_splitmix64(&rng_counter);
      uVar18 = local_48;
    }
    memset(local_90,0xff,__nmemb);
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  free(pvVar13);
  free(__ptr_03);
  puts("populating failed");
  __ptr_04 = local_90;
LAB_00102098:
  free(local_98);
  sVar21 = (__nmemb + 7 >> 3) + 0xc;
  for (uVar18 = 0; __nmemb != uVar18; uVar18 = uVar18 + 1) {
    sVar21 = (sVar21 + 1) - (ulong)(*(char *)((long)__ptr_04 + uVar18) == '\0');
  }
  sVar14 = __nmemb + 0x1c;
  free(__ptr_04);
LAB_001020da:
  sVar38.pack = sVar21;
  sVar38.standard = sVar14;
  return sVar38;
LAB_001020fd:
  for (; local_c0 < uVar24; local_c0 = local_c0 - 1) {
    uVar18 = *(ulong *)((long)pvVar13 + (ulong)local_c0 * 8);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar18;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar19;
    local_b8[0] = SUB164(auVar6 * auVar9,8);
    local_b8[1] = (uint)(uVar18 >> 0x12) & (uint)local_70 ^ iVar34 + local_b8[0];
    local_b8[2] = uVar33 & (uint)uVar18 ^ iVar22 + local_b8[0];
    local_b8[3] = local_b8[0];
    uVar32 = (ulong)*(byte *)((long)__ptr_01 + (ulong)local_c0);
    local_a8 = local_b8[1];
    *(byte *)((long)local_90 + (ulong)local_b8[uVar32]) =
         (byte)(uVar18 >> 0x20) ^ (byte)uVar18 ^
         *(byte *)((long)local_90 + (ulong)local_b8[uVar32 + 1]) ^
         *(byte *)((long)local_90 + (ulong)local_b8[uVar32 + 2]);
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  free(pvVar13);
  free(__ptr_03);
  goto LAB_00102098;
}

Assistant:

sizes fuse8(size_t n) {
  binary_fuse8_t filter = {0};
  if (! binary_fuse8_allocate(n, &filter)) {
    printf("allocation failed\n");
    return (sizes) {0, 0};
  }
  uint64_t* big_set = malloc(n * sizeof(uint64_t));
  for(size_t i = 0; i < n; i++) {
    big_set[i] = i;
  }
  bool is_ok = binary_fuse8_populate(big_set, n, &filter);
  if(! is_ok ) {
    printf("populating failed\n");
  }
  free(big_set);
  sizes s = {
    .standard = binary_fuse8_serialization_bytes(&filter),
    .pack = binary_fuse8_pack_bytes(&filter)
  };
  binary_fuse8_free(&filter);
  return s;
}